

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O2

vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *
upb::generator::SortedEnums
          (vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__return_storage_ptr__,
          FileDefPtr file,WhichEnums which)

{
  pointer pEVar1;
  pointer pEVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  upb_EnumDef *e;
  MessageDefPtr message;
  ulong uVar7;
  __normal_iterator<upb::EnumDefPtr_*,_std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>_>
  __i;
  pointer pEVar8;
  int i;
  EnumDefPtr local_30;
  
  (__return_storage_ptr__->super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = upb_FileDef_TopLevelEnumCount(file.ptr_);
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::reserve
            (__return_storage_ptr__,(long)iVar5);
  iVar5 = 0;
  do {
    iVar6 = upb_FileDef_TopLevelEnumCount(file.ptr_);
    if (iVar6 <= iVar5) {
      iVar5 = 0;
      while( true ) {
        iVar6 = upb_FileDef_TopLevelMessageCount(file.ptr_);
        if (iVar6 <= iVar5) break;
        message.ptr_ = upb_FileDef_TopLevelMessage(file.ptr_,iVar5);
        AddEnums(message,__return_storage_ptr__,which);
        iVar5 = iVar5 + 1;
      }
      pEVar1 = (__return_storage_ptr__->
               super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pEVar2 = (__return_storage_ptr__->
               super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pEVar1 != pEVar2) {
        uVar7 = (long)pEVar2 - (long)pEVar1 >> 3;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<upb::EnumDefPtr*,std::vector<upb::EnumDefPtr,std::allocator<upb::EnumDefPtr>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::SortedEnums(upb::FileDefPtr,upb::generator::WhichEnums)::__0>>
                  (pEVar1,pEVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pEVar2 - (long)pEVar1 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<upb::EnumDefPtr*,std::vector<upb::EnumDefPtr,std::allocator<upb::EnumDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::SortedEnums(upb::FileDefPtr,upb::generator::WhichEnums)::__0>>
                    (pEVar1,pEVar2);
        }
        else {
          pEVar8 = pEVar1 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<upb::EnumDefPtr*,std::vector<upb::EnumDefPtr,std::allocator<upb::EnumDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::SortedEnums(upb::FileDefPtr,upb::generator::WhichEnums)::__0>>
                    (pEVar1,pEVar8);
          for (; pEVar8 != pEVar2; pEVar8 = pEVar8 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<upb::EnumDefPtr*,std::vector<upb::EnumDefPtr,std::allocator<upb::EnumDefPtr>>>,__gnu_cxx::__ops::_Val_comp_iter<upb::generator::SortedEnums(upb::FileDefPtr,upb::generator::WhichEnums)::__0>>
                      (pEVar8);
          }
        }
      }
      return __return_storage_ptr__;
    }
    e = upb_FileDef_TopLevelEnum(file.ptr_,iVar5);
    if (which == kAllEnums) {
LAB_00260d8d:
      local_30.ptr_ = upb_FileDef_TopLevelEnum(file.ptr_,iVar5);
      std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::emplace_back<upb::EnumDefPtr>
                (__return_storage_ptr__,&local_30);
    }
    else {
      _Var4 = upb_EnumDef_IsClosed(e);
      if (_Var4) goto LAB_00260d8d;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

std::vector<upb::EnumDefPtr> SortedEnums(upb::FileDefPtr file,
                                         WhichEnums which) {
  std::vector<upb::EnumDefPtr> enums;
  enums.reserve(file.toplevel_enum_count());
  for (int i = 0; i < file.toplevel_enum_count(); i++) {
    upb::EnumDefPtr top_level_enum = file.toplevel_enum(i);
    if (which == kAllEnums || top_level_enum.is_closed()) {
      enums.push_back(file.toplevel_enum(i));
    }
  }
  for (int i = 0; i < file.toplevel_message_count(); i++) {
    AddEnums(file.toplevel_message(i), &enums, which);
  }
  std::sort(enums.begin(), enums.end(),
            [](upb::EnumDefPtr a, upb::EnumDefPtr b) {
              return strcmp(a.full_name(), b.full_name()) < 0;
            });
  return enums;
}